

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall
cmMakefile::AddSubDirectory
          (cmMakefile *this,string *srcPath,string *binPath,bool excludeFromAll,bool immediate)

{
  Snapshot snapshot;
  cmMakefile *this_00;
  bool bVar1;
  cmState *this_01;
  cmGlobalGenerator *pcVar2;
  allocator local_a1;
  string local_a0;
  cmMakefile *local_80;
  cmMakefile *subMf;
  cmState *local_70;
  cmLinkedTree<cmState::SnapshotDataType> *local_68;
  cmLocalGenerator *local_60;
  cmLocalGenerator *lg2;
  cmLinkedTree<cmState::SnapshotDataType> *local_50;
  PositionType local_48;
  undefined1 local_40 [8];
  Snapshot newSnapshot;
  bool immediate_local;
  bool excludeFromAll_local;
  string *binPath_local;
  string *srcPath_local;
  cmMakefile *this_local;
  
  newSnapshot.Position.Position._6_1_ = immediate;
  newSnapshot.Position.Position._7_1_ = excludeFromAll;
  bVar1 = EnforceUniqueDir(this,srcPath,binPath);
  if (bVar1) {
    this_01 = GetState(this);
    lg2 = (cmLocalGenerator *)(this->StateSnapshot).State;
    local_50 = (this->StateSnapshot).Position.Tree;
    local_48 = (this->StateSnapshot).Position.Position;
    cmState::CreateBuildsystemDirectorySnapshot((Snapshot *)local_40,this_01,this->StateSnapshot);
    pcVar2 = GetGlobalGenerator(this);
    subMf = (cmMakefile *)local_40;
    local_70 = newSnapshot.State;
    local_68 = newSnapshot.Position.Tree;
    snapshot.Position.Tree = (cmLinkedTree<cmState::SnapshotDataType> *)newSnapshot.State;
    snapshot.State = (cmState *)local_40;
    snapshot.Position.Position = (PositionType)newSnapshot.Position.Tree;
    local_60 = cmGlobalGenerator::MakeLocalGenerator(pcVar2,snapshot,this->LocalGenerator);
    pcVar2 = GetGlobalGenerator(this);
    cmGlobalGenerator::AddLocalGenerator(pcVar2,local_60);
    local_80 = cmLocalGenerator::GetMakefile(local_60);
    SetCurrentSourceDirectory(local_80,srcPath);
    SetCurrentBinaryDirectory(local_80,binPath);
    this_00 = local_80;
    if ((newSnapshot.Position.Position._7_1_ & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_a0,"EXCLUDE_FROM_ALL",&local_a1);
      SetProperty(this_00,&local_a0,"TRUE");
      std::__cxx11::string::~string((string *)&local_a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    }
    if ((newSnapshot.Position.Position._6_1_ & 1) == 0) {
      std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::push_back
                (&this->UnConfiguredDirectories,&local_80);
    }
    else {
      ConfigureSubDirectory(this,local_80);
    }
  }
  return;
}

Assistant:

void cmMakefile::AddSubDirectory(const std::string& srcPath,
                                 const std::string& binPath,
                                 bool excludeFromAll,
                                 bool immediate)
{
  // Make sure the binary directory is unique.
  if(!this->EnforceUniqueDir(srcPath, binPath))
    {
    return;
    }

  cmState::Snapshot newSnapshot = this->GetState()
      ->CreateBuildsystemDirectorySnapshot(this->StateSnapshot);

  // create a new local generator and set its parent
  cmLocalGenerator *lg2 = this->GetGlobalGenerator()
        ->MakeLocalGenerator(newSnapshot, this->LocalGenerator);
  this->GetGlobalGenerator()->AddLocalGenerator(lg2);

  cmMakefile* subMf = lg2->GetMakefile();

  // set the subdirs start dirs
  subMf->SetCurrentSourceDirectory(srcPath);
  subMf->SetCurrentBinaryDirectory(binPath);
  if(excludeFromAll)
    {
    subMf->SetProperty("EXCLUDE_FROM_ALL", "TRUE");
    }

  if (immediate)
    {
    this->ConfigureSubDirectory(subMf);
    }
  else
    {
    this->UnConfiguredDirectories.push_back(subMf);
    }
}